

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int IoCommandWriteBook(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int c;
  char *pFileName;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if ((iVar1 == -1) && (argc == globalUtilOptind + 1)) {
    Io_Write(pAbc->pNtkCur,argv[globalUtilOptind],IO_FILE_BOOK);
    pAbc_local._4_4_ = 0;
  }
  else {
    fprintf((FILE *)pAbc->Err,"usage: write_book [-h] <file> [-options]\n");
    fprintf((FILE *)pAbc->Err,"\t-h     : prints the help massage\n");
    fprintf((FILE *)pAbc->Err,
            "\tfile   : the name of the file to write (extension .aux, .nodes, .nets)\n");
    fprintf((FILE *)pAbc->Err,"\t\n");
    fprintf((FILE *)pAbc->Err,
            "\tThis command is developed by Myungchul Kim (University of Michigan).\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int IoCommandWriteBook( Abc_Frame_t * pAbc, int argc, char **argv )
{
    char * pFileName;
        int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the output file name
    pFileName = argv[globalUtilOptind];
        // call the corresponding file writer
    Io_Write( pAbc->pNtkCur, pFileName, IO_FILE_BOOK );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: write_book [-h] <file> [-options]\n" );
    fprintf( pAbc->Err, "\t-h     : prints the help massage\n" );
    fprintf( pAbc->Err, "\tfile   : the name of the file to write (extension .aux, .nodes, .nets)\n" );
    fprintf( pAbc->Err, "\t\n" );
    fprintf( pAbc->Err, "\tThis command is developed by Myungchul Kim (University of Michigan).\n" );
    return 1;
}